

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient2dslow(double *pa,double *pb,double *pc)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double deter [16];
  double adStack_110 [17];
  double local_88;
  double local_80;
  double dStack_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  double local_50;
  double local_48;
  double local_40;
  double dStack_38;
  double local_30;
  double dStack_28;
  double local_20;
  double dStack_18;
  double local_10;
  
  dVar11 = *pa;
  dVar3 = pa[1];
  dVar2 = *pc;
  dVar7 = pc[1];
  dVar6 = dVar11 - dVar2;
  dVar8 = (dVar11 - (dVar6 + (dVar11 - dVar6))) + ((dVar11 - dVar6) - dVar2);
  dVar5 = dVar3 - dVar7;
  dVar4 = (dVar3 - (dVar5 + (dVar3 - dVar5))) + ((dVar3 - dVar5) - dVar7);
  dVar11 = *pb;
  dVar3 = pb[1];
  dVar10 = dVar11 - dVar2;
  adStack_110[0] = 0.0;
  dVar2 = (dVar11 - (dVar10 + (dVar11 - dVar10))) + ((dVar11 - dVar10) - dVar2);
  dVar16 = dVar3 - dVar7;
  dVar12 = (dVar3 - (dVar16 + (dVar3 - dVar16))) + ((dVar3 - dVar16) - dVar7);
  dVar3 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar15 = dVar8 - dVar3;
  dVar11 = dVar6 * splitter - (dVar6 * splitter - dVar6);
  dVar13 = dVar6 - dVar11;
  dVar17 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = splitter * dVar16 - (splitter * dVar16 - dVar16);
  dVar9 = dVar8 * dVar12;
  dVar8 = dVar8 * dVar16;
  dVar7 = dVar6 * dVar12;
  dVar6 = dVar6 * dVar16;
  dVar12 = dVar12 - dVar17;
  dVar16 = dVar16 - dVar18;
  local_48 = dVar15 * dVar12 - (((dVar9 - dVar3 * dVar17) - dVar15 * dVar17) - dVar3 * dVar12);
  dVar17 = dVar13 * dVar12 - (((dVar7 - dVar11 * dVar17) - dVar13 * dVar17) - dVar11 * dVar12);
  dVar14 = dVar13 * dVar16 - (((dVar6 - dVar11 * dVar18) - dVar13 * dVar18) - dVar11 * dVar16);
  dVar12 = dVar9 + dVar17;
  dVar13 = dVar8 + dVar14;
  dVar11 = dVar7 + dVar12;
  dVar19 = dVar12 - (dVar11 - dVar7);
  dVar16 = dVar16 * dVar15 - (((dVar8 - dVar3 * dVar18) - dVar18 * dVar15) - dVar3 * dVar16);
  dVar3 = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar17 - (dVar12 - dVar9));
  dVar7 = (dVar8 - (dVar13 - (dVar13 - dVar8))) + (dVar14 - (dVar13 - dVar8));
  dVar8 = dVar16 + dVar3;
  dVar17 = dVar19 + dVar8;
  dVar12 = (dVar19 - (dVar17 - (dVar17 - dVar19))) + (dVar8 - (dVar17 - dVar19));
  dVar9 = dVar11 + dVar17;
  dVar11 = (dVar11 - (dVar9 - (dVar9 - dVar11))) + (dVar17 - (dVar9 - dVar11));
  dVar17 = dVar7 + dVar12;
  local_40 = (dVar16 - (dVar8 - dVar3)) + (dVar3 - (dVar8 - (dVar8 - dVar3)));
  dStack_38 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar7 - (dVar17 - dVar12));
  dVar16 = dVar6 + dVar13;
  dVar7 = dVar11 + dVar17;
  dVar8 = dVar9 + dVar7;
  dVar9 = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar7 - (dVar8 - dVar9));
  dVar3 = (dVar6 - (dVar16 - (dVar16 - dVar6))) + (dVar13 - (dVar16 - dVar6));
  dVar7 = (dVar11 - (dVar7 - (dVar7 - dVar11))) + (dVar17 - (dVar7 - dVar11));
  dVar13 = dVar7 + dVar3;
  dVar11 = dVar9 + dVar13;
  dVar9 = (dVar9 - (dVar11 - (dVar11 - dVar9))) + (dVar13 - (dVar11 - dVar9));
  dVar12 = dVar8 + dVar11;
  dVar6 = (dVar8 - (dVar12 - (dVar12 - dVar8))) + (dVar11 - (dVar12 - dVar8));
  dVar8 = dVar9 + dVar16;
  local_30 = (dVar7 - (dVar13 - (dVar13 - dVar7))) + (dVar3 - (dVar13 - dVar7));
  dStack_28 = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar16 - (dVar8 - dVar9));
  dVar11 = dVar6 + dVar8;
  local_10 = dVar12 + dVar11;
  local_20 = (dVar6 - (dVar11 - (dVar11 - dVar6))) + (dVar8 - (dVar11 - dVar6));
  dStack_18 = (dVar12 - (local_10 - (local_10 - dVar12))) + (dVar11 - (local_10 - dVar12));
  dVar17 = splitter * dVar2 - (splitter * dVar2 - dVar2);
  dVar12 = dVar2 - dVar17;
  dVar13 = dVar10 * splitter - (dVar10 * splitter - dVar10);
  dVar9 = dVar10 - dVar13;
  dVar6 = -dVar4;
  dVar8 = -dVar5;
  dVar3 = splitter * dVar6 - (splitter * dVar6 + dVar4);
  dVar7 = splitter * dVar8 - (dVar5 + splitter * dVar8);
  dVar11 = dVar2 * dVar6;
  dVar2 = dVar2 * dVar8;
  dVar4 = dVar10 * dVar6;
  dVar10 = dVar10 * dVar8;
  dVar6 = dVar6 - dVar3;
  dVar8 = dVar8 - dVar7;
  local_88 = dVar12 * dVar6 - (((dVar11 - dVar17 * dVar3) - dVar12 * dVar3) - dVar17 * dVar6);
  dVar6 = dVar9 * dVar6 - (((dVar4 - dVar13 * dVar3) - dVar9 * dVar3) - dVar13 * dVar6);
  dVar9 = dVar9 * dVar8 - (((dVar10 - dVar13 * dVar7) - dVar9 * dVar7) - dVar13 * dVar8);
  dVar3 = dVar11 + dVar6;
  dVar5 = dVar2 + dVar9;
  dVar13 = dVar4 + dVar3;
  dVar16 = dVar3 - (dVar13 - dVar4);
  dVar4 = dVar8 * dVar12 - (((dVar2 - dVar17 * dVar7) - dVar7 * dVar12) - dVar17 * dVar8);
  dVar11 = (dVar11 - (dVar3 - (dVar3 - dVar11))) + (dVar6 - (dVar3 - dVar11));
  dVar3 = (dVar2 - (dVar5 - (dVar5 - dVar2))) + (dVar9 - (dVar5 - dVar2));
  dVar7 = dVar4 + dVar11;
  dVar8 = dVar16 + dVar7;
  dVar6 = (dVar16 - (dVar8 - (dVar8 - dVar16))) + (dVar7 - (dVar8 - dVar16));
  dVar2 = dVar13 + dVar8;
  dVar9 = (dVar13 - (dVar2 - (dVar2 - dVar13))) + (dVar8 - (dVar2 - dVar13));
  dVar8 = dVar3 + dVar6;
  local_80 = (dVar4 - (dVar7 - dVar11)) + (dVar11 - (dVar7 - (dVar7 - dVar11)));
  dStack_78 = (dVar6 - (dVar8 - (dVar8 - dVar6))) + (dVar3 - (dVar8 - dVar6));
  dVar4 = dVar10 + dVar5;
  dVar11 = dVar9 + dVar8;
  dVar3 = dVar2 + dVar11;
  dVar2 = (dVar2 - (dVar3 - (dVar3 - dVar2))) + (dVar11 - (dVar3 - dVar2));
  dVar12 = (dVar10 - (dVar4 - (dVar4 - dVar10))) + (dVar5 - (dVar4 - dVar10));
  dVar8 = (dVar9 - (dVar11 - (dVar11 - dVar9))) + (dVar8 - (dVar11 - dVar9));
  dVar6 = dVar8 + dVar12;
  dVar11 = dVar2 + dVar6;
  dVar2 = (dVar2 - (dVar11 - (dVar11 - dVar2))) + (dVar6 - (dVar11 - dVar2));
  dVar5 = dVar3 + dVar11;
  dVar3 = (dVar3 - (dVar5 - (dVar5 - dVar3))) + (dVar11 - (dVar5 - dVar3));
  dVar7 = dVar2 + dVar4;
  local_70 = (dVar8 - (dVar6 - (dVar6 - dVar8))) + (dVar12 - (dVar6 - dVar8));
  dStack_68 = (dVar2 - (dVar7 - (dVar7 - dVar2))) + (dVar4 - (dVar7 - dVar2));
  dVar11 = dVar3 + dVar7;
  local_50 = dVar5 + dVar11;
  local_60 = (dVar3 - (dVar11 - (dVar11 - dVar3))) + (dVar7 - (dVar11 - dVar3));
  dStack_58 = (dVar5 - (local_50 - (local_50 - dVar5))) + (dVar11 - (local_50 - dVar5));
  iVar1 = fast_expansion_sum_zeroelim(8,&local_48,8,&local_88,adStack_110 + 1);
  return adStack_110[iVar1];
}

Assistant:

REAL orient2dslow(REAL *pa, REAL *pb, REAL *pc)
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail;
  REAL bcxtail, bcytail;
  REAL negate, negatetail;
  REAL axby[8], bxay[8];
  INEXACT REAL axby7, bxay7;
  REAL deter[16];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pc[0], acx, acxtail);
  Two_Diff(pa[1], pc[1], acy, acytail);
  Two_Diff(pb[0], pc[0], bcx, bcxtail);
  Two_Diff(pb[1], pc[1], bcy, bcytail);

  Two_Two_Product(acx, acxtail, bcy, bcytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -acy;
  negatetail = -acytail;
  Two_Two_Product(bcx, bcxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;

  deterlen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, deter);

  return deter[deterlen - 1];
}